

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall Client::handleRegisterRequest(Client *this,RegisterRequest *request)

{
  CommunicationStack *pCVar1;
  bool bVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  Event EVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_150;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_140;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)request);
  bVar2 = Database::containsForbiddenChars(&local_50);
  if (bVar2) {
LAB_0010fcc3:
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_110,(string *)&request->password);
    bVar2 = Database::containsForbiddenChars(&local_110);
    if (bVar2) {
LAB_0010fcb9:
      std::__cxx11::string::~string((string *)&local_110);
      goto LAB_0010fcc3;
    }
    std::__cxx11::string::string((string *)&local_130,(string *)&request->alias);
    bVar2 = Database::containsForbiddenChars(&local_130);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_130);
      goto LAB_0010fcb9;
    }
    std::__cxx11::string::string((string *)&local_70,(string *)&request->bio);
    bVar2 = Database::containsForbiddenChars(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_90,(string *)request);
      std::__cxx11::string::string((string *)&local_b0,(string *)&request->alias);
      std::__cxx11::string::string((string *)&local_d0,(string *)&request->bio);
      std::__cxx11::string::string((string *)&local_f0,(string *)&request->password);
      Database::addUser(&server.database,&local_90,&local_b0,&local_d0,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      pCVar1 = this->communicationStack;
      EVar3 = RegisterResponse::operator_cast_to_basic_json((RegisterResponse *)&local_150);
      (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_150,EVar3.m_value.object);
      this_00 = &local_150;
      goto LAB_0010fcfa;
    }
  }
  pCVar1 = this->communicationStack;
  EVar3 = RegisterResponse::operator_cast_to_basic_json((RegisterResponse *)&local_140);
  (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_140,EVar3.m_value.object);
  this_00 = &local_140;
LAB_0010fcfa:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(this_00);
  return;
}

Assistant:

void Client::handleRegisterRequest(RegisterRequest request)
{
	if(Database::containsForbiddenChars(request.username) ||
			Database::containsForbiddenChars(request.password) ||
			Database::containsForbiddenChars(request.alias) ||
			Database::containsForbiddenChars(request.bio))
	{
		communicationStack->sendEvent(RegisterResponse(false));
	}
	else
	{
		server.database.addUser(request.username, request.alias, request.bio, request.password);
		communicationStack->sendEvent(RegisterResponse(true));
	}
}